

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putkey.c
# Opt level: O2

int ffpknd(fitsfile *fptr,char *keyroot,int nstart,int nkey,double *value,int decim,char **comm,
          int *status)

{
  bool bVar1;
  size_t sVar2;
  ulong uVar3;
  char *pcVar4;
  int iVar5;
  ulong uVar6;
  char tcomment [73];
  char keyname [75];
  
  iVar5 = *status;
  if (iVar5 < 1) {
    if (comm == (char **)0x0) {
      tcomment[0] = '\0';
LAB_001e848d:
      bVar1 = false;
    }
    else {
      pcVar4 = *comm;
      sVar2 = strlen(pcVar4);
      uVar3 = sVar2 & 0xffffffff;
      while( true ) {
        bVar1 = true;
        if ((int)(uint)uVar3 < 1) break;
        if (pcVar4[uVar3 - 1] != ' ') {
          if (pcVar4[uVar3 - 1] == '&') {
            uVar6 = 0x49;
            if ((uint)uVar3 < 0x49) {
              uVar6 = uVar3;
            }
            tcomment[0] = '\0';
            strncat(tcomment,pcVar4,(ulong)((int)uVar6 - 1));
            goto LAB_001e848d;
          }
          break;
        }
        uVar3 = uVar3 - 1;
      }
    }
    uVar6 = 0;
    uVar3 = (ulong)(uint)nkey;
    if (nkey < 1) {
      uVar3 = uVar6;
    }
    for (; uVar3 != uVar6; uVar6 = uVar6 + 1) {
      ffkeyn(keyroot,nstart + (int)uVar6,keyname,status);
      if (bVar1) {
        pcVar4 = comm[uVar6];
      }
      else {
        pcVar4 = tcomment;
      }
      ffpkyd(fptr,keyname,value[uVar6],decim,pcVar4,status);
      iVar5 = *status;
      if (0 < iVar5) {
        return iVar5;
      }
    }
  }
  return iVar5;
}

Assistant:

int ffpknd( fitsfile *fptr,     /* I - FITS file pointer                    */
            const char *keyroot,      /* I - root name of keywords to write       */
            int  nstart,        /* I - starting index number                */
            int  nkey,          /* I - number of keywords to write          */
            double *value,      /* I - array of keyword values              */
            int decim,          /* I - number of decimals to display        */
            char *comm[],       /* I - array of pointers to keyword comment */
            int  *status)       /* IO - error status                        */
/*
  Write (put) an indexed array of keywords with index numbers between
  NSTART and (NSTART + NKEY -1) inclusive.  Writes exponential double values.
*/
{
    char keyname[FLEN_KEYWORD], tcomment[FLEN_COMMENT];
    int ii, jj, repeat, len;

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    /* check if first comment string is to be repeated for all the keywords */
    /* by looking to see if the last non-blank character is a '&' char      */

    repeat = 0;

    if (comm)
    {
      len = strlen(comm[0]);

      while (len > 0  && comm[0][len - 1] == ' ')
        len--;                               /* ignore trailing blanks */

      if (len > 0 && comm[0][len - 1] == '&')
      {
        len = minvalue(len, FLEN_COMMENT);
        tcomment[0] = '\0';
        strncat(tcomment, comm[0], len-1); /* don't copy the final '&' char */
        repeat = 1;
      }
    }
    else
    {
      repeat = 1;
      tcomment[0] = '\0';
    }

    for (ii=0, jj=nstart; ii < nkey; ii++, jj++)
    {
        ffkeyn(keyroot, jj, keyname, status);
        if (repeat)
            ffpkyd(fptr, keyname, value[ii], decim, tcomment, status);
        else
            ffpkyd(fptr, keyname, value[ii], decim, comm[ii], status);

        if (*status > 0)
            return(*status);
    }
    return(*status);
}